

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

Am_Object create_script_for(Am_Value_List *commands_for_script,Am_Input_Char accel_char,
                           Am_String *name,bool on_new,Am_Object *window,Am_Object *selection_widget
                           )

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  undefined7 in_register_00000009;
  int value;
  undefined4 in_register_00000034;
  Am_Value_List *this;
  Am_Object *execute_script_command;
  Am_Object *in_stack_00000008;
  int cnt;
  Am_Value_List new_cmd_list;
  Am_Value_List original_command_list;
  Am_Object new_cmd;
  Am_Object cmd;
  Am_Object placeholder;
  Am_Value created_objects;
  Am_Value_List created_objects_assoc;
  Am_Value_List placeholder_list;
  int local_bc;
  Am_Value_List local_b8;
  Am_Value_List local_a8;
  Am_Object local_98;
  Am_Object local_90;
  Am_Input_Char local_84;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value local_68;
  Am_Value_List local_58;
  Am_Value_List local_48;
  Am_Object local_38;
  
  this = (Am_Value_List *)CONCAT44(in_register_00000034,accel_char);
  local_84 = SUB84(name,0);
  local_90.data = (Am_Object_Data *)0x0;
  local_98.data = (Am_Object_Data *)0x0;
  Am_Object::Create((Am_Object *)&local_b8,(char *)&Am_Execute_Script_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_b8,0x150,
                          (Am_String *)CONCAT71(in_register_00000009,on_new),0);
  Am_Input_Char::operator_cast_to_Am_Value(&local_84);
  pAVar3 = Am_Object::Set(pAVar3,0x152,(Am_Value *)&local_a8,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(selection_widget);
  pAVar3 = Am_Object::Add(pAVar3,0x68,pAVar4,0);
  pAVar3 = Am_Object::Add(pAVar3,Am_EXECUTE_SCRIPT_ON_NEW,SUB81(window,0),0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(in_stack_00000008);
  pAVar3 = Am_Object::Add(pAVar3,0x197,pAVar4,0);
  Am_Object::Am_Object((Am_Object *)commands_for_script,pAVar3);
  Am_Value::~Am_Value((Am_Value *)&local_a8);
  Am_Object::~Am_Object((Am_Object *)&local_b8);
  Am_Value_List::Am_Value_List(&local_a8);
  Am_Value_List::Am_Value_List(&local_b8);
  Am_Value_List::Am_Value_List(&local_48);
  Am_Value_List::Am_Value_List(&local_58);
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  local_bc = 0;
  Am_Value_List::End(this);
  value = 1;
  while( true ) {
    bVar2 = Am_Value_List::First(this);
    AVar1 = Am_COMMANDS_PROTOTYPES;
    if (bVar2) break;
    pAVar5 = Am_Value_List::Get(this);
    Am_Object::operator=(&local_90,pAVar5);
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nprocessing command ",0x14);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      poVar6 = operator<<(poVar6,&local_90);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ostream::flush();
    }
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
    Am_Value_List::Add(&local_a8,pAVar4,Am_TAIL,true);
    Am_Object::Copy_Value_Only(&local_38,(char *)&local_90);
    Am_Object::operator=(&local_98,&local_38);
    Am_Object::~Am_Object(&local_38);
    Am_Object::Set(&local_98,Am_COMMAND_INDEX_IN_SCRIPT,value,1);
    Am_Object::Am_Object(&local_78,&Am_Object_Create_Command);
    bVar2 = Am_Object::Is_Instance_Of(&local_98,&local_78);
    Am_Object::~Am_Object(&local_78);
    if (bVar2) {
      am_check_start_obj_parameters(&local_98,&local_48,&local_58,&local_bc);
    }
    else {
      am_check_obj_modified(&local_98,&local_48,&local_58,&local_bc);
    }
    Am_Object::Am_Object(&local_80,&Am_Defines_A_Collection_Command);
    bVar2 = Am_Object::Is_Instance_Of(&local_98,&local_80);
    Am_Object::~Am_Object(&local_80);
    if (bVar2) {
      pAVar5 = Am_Object::Get(&local_98,0x169,0);
      Am_Value::operator=(&local_68,pAVar5);
      am_note_created_objects(&local_98,&local_68,&local_58);
    }
    Am_Object::Set(&local_98,0x154,-10,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
    Am_Value_List::Add(&local_b8,pAVar4,Am_TAIL,true);
    Am_Value_List::Prev(this);
    value = value + 1;
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_b8);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_b8);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_a8);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_PLACEHOLDER_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_48);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  Am_Object::Set((Am_Object *)commands_for_script,Am_PLACEHOLDER_COUNT,local_bc,0);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"%% Execute command ",0x13);
    poVar6 = operator<<((ostream *)&std::cout,(Am_Object *)commands_for_script);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," orig ",6);
    poVar6 = operator<<(poVar6,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," new ",5);
    poVar6 = operator<<(poVar6,&local_b8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Object::~Am_Object(&local_70);
  Am_Value::~Am_Value(&local_68);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Value_List::~Am_Value_List(&local_48);
  Am_Value_List::~Am_Value_List(&local_b8);
  Am_Value_List::~Am_Value_List(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_90);
  return (Am_Object)(Am_Object_Data *)commands_for_script;
}

Assistant:

Am_Object
create_script_for(Am_Value_List &commands_for_script, Am_Input_Char accel_char,
                  Am_String &name, bool on_new, Am_Object &window,
                  Am_Object &selection_widget)
{
  Am_Object cmd, new_cmd;
  Am_Object execute_script_command =
      Am_Execute_Script_Command.Create()
          .Set(Am_LABEL, name)
          .Set(Am_ACCELERATOR, accel_char)
          .Add(Am_WINDOW, window)
          .Add(Am_EXECUTE_SCRIPT_ON_NEW, on_new)
          .Add(Am_SELECTION_WIDGET, selection_widget);
  Am_Value_List original_command_list, new_cmd_list, placeholder_list,
      created_objects_assoc;
  Am_Value created_objects;
  Am_Object placeholder;
  int cnt = 0;
  int command_index = 1;
  //commands come in backwards, swap them
  for (commands_for_script.End(); !commands_for_script.First();
       commands_for_script.Prev(), command_index++) {
    cmd = commands_for_script.Get();
    if (am_sdebug)
      std::cout << "\nprocessing command " << command_index << ": " << cmd
                << std::endl
                << std::flush;
    original_command_list.Add(cmd);
    new_cmd = cmd.Copy_Value_Only();
    new_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, command_index, Am_OK_IF_NOT_THERE);
    //if not creating from scratch, then check the parameters
    //group_command is both a from_create AND it needs its parameters munged
    if (new_cmd.Is_Instance_Of(Am_Object_Create_Command))
      am_check_start_obj_parameters(new_cmd, placeholder_list,
                                    created_objects_assoc, cnt);
    else
      am_check_obj_modified(new_cmd, placeholder_list, created_objects_assoc,
                            cnt);
    //be sure to note created objects AFTER dealing with the parameters of
    //this command, so this command won't refer to itself
    if (new_cmd.Is_Instance_Of(Am_Defines_A_Collection_Command)) {
      created_objects = new_cmd.Get(Am_VALUE);
      am_note_created_objects(new_cmd, created_objects, created_objects_assoc);
    }

    new_cmd.Set(Am_IMPLEMENTATION_PARENT, Am_IN_A_SCRIPT);
    new_cmd_list.Add(new_cmd);
  }
  //when script is executed, the Am_COMMANDS_IN_SCRIPT gets the new cmds,
  //which can be undone, but the Am_COMMANDS_PROTOTYPES stay the same
  execute_script_command.Set(Am_COMMANDS_PROTOTYPES, new_cmd_list);
  execute_script_command.Set(Am_COMMANDS_IN_SCRIPT, new_cmd_list);
  execute_script_command.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);
  execute_script_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_script_command.Set(Am_PLACEHOLDER_COUNT, cnt);

  if (am_sdebug)
    std::cout << "%% Execute command " << execute_script_command << " orig "
              << original_command_list << " new " << new_cmd_list << std::endl
              << std::flush;
  return execute_script_command;
}